

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMeshSurface.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChMeshSurface::AddFacesFromNodeSet
          (ChMeshSurface *this,
          vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
          *node_set)

{
  pointer psVar1;
  ChMesh *pCVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  iterator iVar6;
  int i;
  ulong uVar7;
  int in;
  uint uVar8;
  long lVar9;
  shared_ptr<chrono::fea::ChTetrahedronFace> sVar10;
  shared_ptr<chrono::fea::ChHexahedronFace> sVar11;
  shared_ptr<chrono::fea::ChElementTetrahedron> tet;
  element_type *local_d0;
  __shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2> local_c8;
  uint local_ac;
  shared_ptr<chrono::fea::ChElementBase> element;
  element_type *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  __shared_ptr<chrono::ChLoadableUV,_(__gnu_cxx::_Lock_policy)2> local_78;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  node_set_map;
  
  node_set_map._M_h._M_buckets = &node_set_map._M_h._M_single_bucket;
  node_set_map._M_h._16_16_ = ZEXT816(0) << 0x40;
  lVar9 = 0;
  node_set_map._M_h._M_bucket_count = 1;
  node_set_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  node_set_map._M_h._40_16_ = node_set_map._M_h._16_16_;
  for (uVar7 = 0;
      psVar1 = (node_set->
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar7 < (ulong)((long)(node_set->
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4);
      uVar7 = uVar7 + 1) {
    element.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)
          ((long)&(psVar1->
                  super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
          + lVar9);
    std::__detail::
    _Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
    ::insert((_Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)&node_set_map,(value_type *)&element);
    lVar9 = lVar9 + 0x10;
  }
  uVar8 = 0;
  while( true ) {
    pCVar2 = this->mmesh;
    if ((uint)((ulong)((long)(pCVar2->velements).
                             super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pCVar2->velements).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 4) <= uVar8) break;
    local_ac = uVar8;
    ChMesh::GetElement((ChMesh *)&element,(uint)pCVar2);
    std::dynamic_pointer_cast<chrono::fea::ChElementTetrahedron,chrono::fea::ChElementBase>
              ((shared_ptr<chrono::fea::ChElementBase> *)&tet);
    if (tet.super___shared_ptr<chrono::fea::ChElementTetrahedron,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      bVar4 = 0;
      for (uVar8 = 0; uVar8 != 4; uVar8 = uVar8 + 1) {
        (*(tet.super___shared_ptr<chrono::fea::ChElementTetrahedron,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->_vptr_ChElementTetrahedron[2])
                  (&local_c8,
                   tet.
                   super___shared_ptr<chrono::fea::ChElementTetrahedron,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,(ulong)uVar8);
        local_d0 = local_c8._M_ptr;
        iVar6 = std::
                _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&node_set_map._M_h,(key_type_conflict *)&local_d0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
        bVar3 = (byte)(1 << (uVar8 & 0x1f));
        if (iVar6.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0) {
          bVar3 = 0;
        }
        bVar4 = bVar3 | bVar4;
      }
      iVar5 = 0;
      while( true ) {
        local_d0 = (element_type *)CONCAT44(local_d0._4_4_,iVar5);
        if (3 < iVar5) break;
        if (((&DAT_00e90b59)[iVar5] & ~bVar4) == 0) {
          sVar10 = std::
                   make_shared<chrono::fea::ChTetrahedronFace,std::shared_ptr<chrono::fea::ChElementTetrahedron>&,int&>
                             ((shared_ptr<chrono::fea::ChElementTetrahedron> *)&local_c8,(int *)&tet
                             );
          aStack_90._8_8_ = local_c8._M_ptr;
          _Stack_80._M_pi = local_c8._M_refcount._M_pi;
          local_c8 = (__shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>)
                     (ZEXT816(0) << 0x20);
          (*this->_vptr_ChMeshSurface[2])
                    (this,aStack_90._M_local_buf + 8,
                     sVar10.
                     super___shared_ptr<chrono::fea::ChTetrahedronFace,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi._M_pi);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_80);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
          iVar5 = (int)local_d0;
        }
        iVar5 = iVar5 + 1;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&tet.
                super___shared_ptr<chrono::fea::ChElementTetrahedron,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::dynamic_pointer_cast<chrono::fea::ChElementHexahedron,chrono::fea::ChElementBase>
              ((shared_ptr<chrono::fea::ChElementBase> *)&tet);
    if (tet.super___shared_ptr<chrono::fea::ChElementTetrahedron,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      bVar4 = 0;
      for (uVar8 = 0; uVar8 != 7; uVar8 = uVar8 + 1) {
        (*(tet.super___shared_ptr<chrono::fea::ChElementTetrahedron,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->_vptr_ChElementTetrahedron[2])
                  (&local_c8,
                   tet.
                   super___shared_ptr<chrono::fea::ChElementTetrahedron,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,(ulong)uVar8);
        local_d0 = local_c8._M_ptr;
        iVar6 = std::
                _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&node_set_map._M_h,(key_type_conflict *)&local_d0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
        bVar3 = (byte)(1 << (uVar8 & 0x1f));
        if (iVar6.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0) {
          bVar3 = 0;
        }
        bVar4 = bVar3 | bVar4;
      }
      iVar5 = 0;
      while( true ) {
        local_d0 = (element_type *)CONCAT44(local_d0._4_4_,iVar5);
        if (5 < iVar5) break;
        if (((&DAT_00e90b5d)[iVar5] & ~bVar4) == 0) {
          sVar11 = std::
                   make_shared<chrono::fea::ChHexahedronFace,std::shared_ptr<chrono::fea::ChElementHexahedron>&,int&>
                             ((shared_ptr<chrono::fea::ChElementHexahedron> *)&local_c8,(int *)&tet)
          ;
          local_98 = local_c8._M_ptr;
          aStack_90._M_allocated_capacity = (size_type)local_c8._M_refcount._M_pi;
          local_c8 = (__shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>)
                     (ZEXT816(0) << 0x20);
          (*this->_vptr_ChMeshSurface[2])
                    (this,&local_98,
                     sVar11.
                     super___shared_ptr<chrono::fea::ChHexahedronFace,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi._M_pi);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&aStack_90._M_allocated_capacity)
          ;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
          iVar5 = (int)local_d0;
        }
        iVar5 = iVar5 + 1;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&tet.
                super___shared_ptr<chrono::fea::ChElementTetrahedron,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::dynamic_pointer_cast<chrono::ChLoadableUV,chrono::fea::ChElementBase>
              ((shared_ptr<chrono::fea::ChElementBase> *)&tet);
    if (tet.super___shared_ptr<chrono::fea::ChElementTetrahedron,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      std::__shared_ptr<chrono::ChLoadableUV,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_78,(__shared_ptr<chrono::ChLoadableUV,_(__gnu_cxx::_Lock_policy)2> *)&tet);
      (*this->_vptr_ChMeshSurface[2])(this,&local_78);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&tet.
                super___shared_ptr<chrono::fea::ChElementTetrahedron,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&element.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    uVar8 = local_ac + 1;
  }
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&node_set_map._M_h);
  return;
}

Assistant:

void ChMeshSurface::AddFacesFromNodeSet(std::vector<std::shared_ptr<ChNodeFEAbase> >& node_set) {
    std::unordered_set<size_t> node_set_map;
    for (int i = 0; i < node_set.size(); ++i)
        node_set_map.insert((size_t)node_set[i].get());

    for (unsigned int ie = 0; ie < this->mmesh->GetNelements(); ++ie) {
        auto element = mmesh->GetElement(ie);

        if (auto tet = std::dynamic_pointer_cast<ChElementTetrahedron>(element)) {
            unsigned char nodes = 0;  // if the i-th bit is 1, the corressponding hex node is in the set
            for (int in = 0; in < 4; in++) {
                if (node_set_map.find((size_t)tet->GetTetrahedronNode(in).get()) != node_set_map.end())
                    nodes |= 1 << in;
            }
            unsigned char masks[] = {
                0x0E,  // 1110 face 0
                0x0D,  // 1101 face 1
                0x0B,  // 1011 face 2
                0x07   // 0111 face 3
            };
            for (int j = 0; j < 4; j++) {
                if ((nodes & masks[j]) == masks[j])
                    AddFace(chrono_types::make_shared<ChTetrahedronFace>(tet, j));
            }
        }

        if (auto hex = std::dynamic_pointer_cast<ChElementHexahedron>(element)) {
            unsigned char nodes = 0;  // if the i-th bit is 1, the corressponding hex node is in the set
            for (int in = 0; in < 7; in++) {
                if (node_set_map.find((size_t)hex->GetHexahedronNode(in).get()) != node_set_map.end())
                    nodes |= 1 << in;
            }
            unsigned char masks[] = {
                0x0F,  // 00001111 face 0
                0x33,  // 00110011 face 1
                0x66,  // 01100110 face 2
                0xCC,  // 11001100 face 3
                0x99,  // 10011001 face 4
                0xF0   // 11110000 face 5
            };
            for (int j = 0; j < 6; j++) {
                if ((nodes & masks[j]) == masks[j])
                    AddFace(chrono_types::make_shared<ChHexahedronFace>(hex, j));
            }
        }

        if (auto shell = std::dynamic_pointer_cast<ChLoadableUV>(element)) {
            this->AddFace(shell);
        }
    }
}